

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::Pipeline::MergePartialFromCodedStream(Pipeline *this,CodedInputStream *input)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  byte bVar1;
  int iVar2;
  byte *pbVar3;
  uint8 *puVar4;
  Arena *this_01;
  char *data;
  bool bVar5;
  uint32 uVar6;
  uint uVar7;
  int iVar8;
  Type *this_02;
  pair<int,_int> pVar9;
  string *value;
  Type *pTVar10;
  ulong uVar11;
  Rep *pRVar12;
  
  this_00 = &this->names_;
LAB_003b34f0:
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003b3513;
      input->buffer_ = pbVar3 + 1;
      uVar11 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003b3513:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar11 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar6 | uVar11;
    }
    uVar6 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) {
LAB_003b35a3:
      if (uVar6 == 0) {
        return true;
      }
      if ((uVar6 & 7) == 4) {
        return true;
      }
      bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6);
    }
    else {
      uVar7 = (uint)(uVar11 >> 3) & 0x1fffffff;
      if (uVar7 == 2) {
        if ((char)uVar11 != '\x12') goto LAB_003b35a3;
        pRVar12 = (this->names_).super_RepeatedPtrFieldBase.rep_;
        if (pRVar12 == (Rep *)0x0) {
          iVar8 = (this->names_).super_RepeatedPtrFieldBase.total_size_;
LAB_003b362c:
          google::protobuf::internal::RepeatedPtrFieldBase::Reserve
                    (&this_00->super_RepeatedPtrFieldBase,iVar8 + 1);
          pRVar12 = (this->names_).super_RepeatedPtrFieldBase.rep_;
          iVar8 = pRVar12->allocated_size;
LAB_003b363d:
          pRVar12->allocated_size = iVar8 + 1;
          this_01 = (this_00->super_RepeatedPtrFieldBase).arena_;
          if (this_01 == (Arena *)0x0) {
            value = (string *)operator_new(0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
          }
          else {
            value = (string *)
                    google::protobuf::Arena::AllocateAligned
                              (this_01,(type_info *)&std::__cxx11::string::typeinfo,0x20);
            (value->_M_dataplus)._M_p = (pointer)&value->field_2;
            value->_M_string_length = 0;
            (value->field_2)._M_local_buf[0] = '\0';
            google::protobuf::Arena::AddListNode
                      (this_01,value,
                       google::protobuf::internal::arena_destruct_object<std::__cxx11::string>);
            pRVar12 = (this->names_).super_RepeatedPtrFieldBase.rep_;
          }
          iVar8 = (this->names_).super_RepeatedPtrFieldBase.current_size_;
          (this->names_).super_RepeatedPtrFieldBase.current_size_ = iVar8 + 1;
          pRVar12->elements[iVar8] = value;
        }
        else {
          iVar2 = (this->names_).super_RepeatedPtrFieldBase.current_size_;
          iVar8 = pRVar12->allocated_size;
          if (iVar8 <= iVar2) {
            if (iVar8 == (this->names_).super_RepeatedPtrFieldBase.total_size_) goto LAB_003b362c;
            goto LAB_003b363d;
          }
          (this->names_).super_RepeatedPtrFieldBase.current_size_ = iVar2 + 1;
          value = (string *)pRVar12->elements[iVar2];
        }
        bVar5 = google::protobuf::internal::WireFormatLite::ReadBytes(input,value);
        if (!bVar5) {
          return false;
        }
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,
                             (this->names_).super_RepeatedPtrFieldBase.current_size_ + -1);
        data = (pTVar10->_M_dataplus)._M_p;
        pTVar10 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                            (&this_00->super_RepeatedPtrFieldBase,
                             (this->names_).super_RepeatedPtrFieldBase.current_size_ + -1);
        bVar5 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                          (data,(int)pTVar10->_M_string_length,PARSE,
                           "CoreML.Specification.Pipeline.names");
        if (!bVar5) {
          return false;
        }
        goto LAB_003b34f0;
      }
      if ((uVar7 != 1) || ((char)uVar11 != '\n')) goto LAB_003b35a3;
      this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::Model>::TypeHandler>
                          (&(this->models_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (iVar8 = (int)(char)*puVar4, -1 < (char)*puVar4)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        iVar8 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        if (iVar8 < 0) {
          return false;
        }
      }
      pVar9 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                        (input,iVar8);
      if ((long)pVar9 < 0) {
        return false;
      }
      bVar5 = Model::MergePartialFromCodedStream(this_02,input);
      if (!bVar5) {
        return false;
      }
      bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                        (input,pVar9.first);
    }
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool Pipeline::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Pipeline)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.Model models = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_models()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated string names = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->add_names()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->names(this->names_size() - 1).data(),
            this->names(this->names_size() - 1).length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Pipeline.names"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Pipeline)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Pipeline)
  return false;
#undef DO_
}